

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O2

int FinishRow(void *arg1,void *arg2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  size_t __n;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  uint8_t *puVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint8_t *puVar25;
  int iVar26;
  uint8_t *puVar27;
  size_t __n_00;
  long lVar28;
  long lVar29;
  long local_78;
  long local_48;
  
  iVar8 = *(int *)((long)arg1 + 0xd8);
  bVar1 = ""[*(int *)((long)arg1 + 0xb68)];
  uVar15 = (uint)bVar1;
  iVar9 = *(int *)((long)arg1 + 0xb40);
  iVar26 = *(int *)((long)arg1 + 0xb44);
  lVar10 = *(long *)((long)arg1 + 0xb28);
  lVar13 = *(long *)((long)arg1 + 0xb30);
  lVar29 = *(long *)((long)arg1 + 0xb38);
  iVar4 = *(int *)((long)arg1 + 0xdc);
  iVar20 = *(int *)((long)arg1 + 0x1ac);
  if (*(int *)((long)arg1 + 200) == 2) {
    ReconstructRow((VP8Decoder *)arg1,(VP8ThreadContext *)((long)arg1 + 0xd8));
  }
  __n_00 = (ulong)uVar15 * (long)iVar9;
  __n = (size_t)(int)((uint)(bVar1 >> 1) * iVar26);
  if (*(int *)((long)arg1 + 0xe0) != 0) {
    iVar16 = *(int *)((long)arg1 + 0xdc);
    lVar22 = (long)*(int *)((long)arg1 + 0x1a0);
    local_48 = lVar22 * 8;
    local_78 = lVar22 << 4;
    for (; lVar22 < *(int *)((long)arg1 + 0x1a8); lVar22 = lVar22 + 1) {
      lVar12 = *(long *)((long)arg1 + 0xe8);
      bVar1 = *(byte *)(lVar12 + lVar22 * 4);
      if (bVar1 != 0) {
        iVar5 = *(int *)((long)arg1 + 0xb40);
        puVar27 = (uint8_t *)
                  ((long)(*(int *)((long)arg1 + 0xd8) * iVar5 * 0x10) +
                   *(long *)((long)arg1 + 0xb28) + local_78);
        if (*(int *)((long)arg1 + 0xb68) == 1) {
          if (0 < lVar22) {
            (*VP8SimpleHFilter16)(puVar27,iVar5,bVar1 + 4);
          }
          if (*(char *)(lVar12 + 2 + lVar22 * 4) != '\0') {
            (*VP8SimpleHFilter16i)(puVar27,iVar5,(uint)bVar1);
          }
          if (0 < iVar16) {
            (*VP8SimpleVFilter16)(puVar27,iVar5,bVar1 + 4);
          }
          if (*(char *)(lVar12 + 2 + lVar22 * 4) != '\0') {
            (*VP8SimpleVFilter16i)(puVar27,iVar5,(uint)bVar1);
          }
        }
        else {
          bVar2 = *(byte *)(lVar12 + 1 + lVar22 * 4);
          iVar14 = *(int *)((long)arg1 + 0xb44);
          lVar24 = (long)(*(int *)((long)arg1 + 0xd8) * iVar14 * 8);
          puVar19 = (uint8_t *)(*(long *)((long)arg1 + 0xb30) + lVar24 + local_48);
          puVar25 = (uint8_t *)(lVar24 + *(long *)((long)arg1 + 0xb38) + local_48);
          bVar3 = *(byte *)(lVar12 + 3 + lVar22 * 4);
          uVar11 = (uint)bVar2;
          uVar21 = (uint)bVar3;
          if (0 < lVar22) {
            (*VP8HFilter16)(puVar27,iVar5,bVar1 + 4,uVar11,uVar21);
            (*VP8HFilter8)(puVar19,puVar25,iVar14,bVar1 + 4,uVar11,uVar21);
          }
          uVar18 = (uint)bVar1;
          if (*(char *)(lVar12 + 2 + lVar22 * 4) != '\0') {
            (*VP8HFilter16i)(puVar27,iVar5,uVar18,uVar11,(uint)bVar3);
            (*VP8HFilter8i)(puVar19,puVar25,iVar14,uVar18,uVar11,uVar21);
          }
          if (0 < iVar16) {
            (*VP8VFilter16)(puVar27,iVar5,uVar18 + 4,uVar11,(uint)bVar3);
            (*VP8VFilter8)(puVar19,puVar25,iVar14,uVar18 + 4,uVar11,uVar21);
          }
          if (*(char *)(lVar12 + 2 + lVar22 * 4) != '\0') {
            (*VP8VFilter16i)(puVar27,iVar5,uVar18,(uint)bVar2,(uint)bVar3);
            (*VP8VFilter8i)(puVar19,puVar25,iVar14,uVar18,(uint)bVar2,(uint)bVar3);
          }
        }
      }
      local_48 = local_48 + 8;
      local_78 = local_78 + 0x10;
    }
  }
  lVar22 = (long)iVar8 * (long)iVar9 * 0x10;
  lVar12 = (long)(iVar26 * iVar8 * 8);
  if (*(int *)((long)arg1 + 0x338) != 0) {
    lVar17 = (long)*(int *)((long)arg1 + 0x1a0);
    lVar24 = lVar17 * 8;
    lVar23 = lVar17 * 100;
    for (; lVar17 < *(int *)((long)arg1 + 0x1a8); lVar17 = lVar17 + 1) {
      lVar6 = *(long *)((long)arg1 + 0xf0);
      uVar11 = (uint)*(byte *)(lVar6 + 0x31c + lVar23 * 8);
      if (3 < uVar11) {
        iVar9 = *(int *)((long)arg1 + 0xb44);
        lVar28 = (long)(*(int *)((long)arg1 + 0xd8) * iVar9 * 8);
        lVar7 = *(long *)((long)arg1 + 0xb38);
        Dither8x8((VP8Random *)((long)arg1 + 0x33c),
                  (uint8_t *)(*(long *)((long)arg1 + 0xb30) + lVar28 + lVar24),iVar9,uVar11);
        Dither8x8((VP8Random *)((long)arg1 + 0x33c),(uint8_t *)(lVar28 + lVar7 + lVar24),iVar9,
                  (uint)*(byte *)(lVar6 + 0x31c + lVar23 * 8));
      }
      lVar24 = lVar24 + 8;
      lVar23 = lVar23 + 100;
    }
  }
  lVar10 = (lVar10 - __n_00) + lVar22;
  lVar13 = (lVar13 - __n) + lVar12;
  lVar29 = (lVar29 - __n) + lVar12;
  iVar20 = iVar20 + -1;
  iVar9 = 1;
  if (*(long *)((long)arg2 + 0x40) != 0) {
    if (iVar4 == 0) {
      lVar22 = lVar22 + *(long *)((long)arg1 + 0xb28);
      lVar24 = *(long *)((long)arg1 + 0xb30) + lVar12;
      lVar12 = lVar12 + *(long *)((long)arg1 + 0xb38);
      iVar26 = 0;
    }
    else {
      iVar26 = iVar4 * 0x10 - uVar15;
      lVar24 = lVar13;
      lVar22 = lVar10;
      lVar12 = lVar29;
    }
    puVar27 = (uint8_t *)0x0;
    *(long *)((long)arg2 + 0x18) = lVar22;
    *(long *)((long)arg2 + 0x20) = lVar24;
    *(long *)((long)arg2 + 0x28) = lVar12;
    if (iVar20 <= iVar4) {
      uVar15 = 0;
    }
    iVar16 = (iVar4 * 0x10 + 0x10) - uVar15;
    if (*(int *)((long)arg2 + 0x84) <= iVar16) {
      iVar16 = *(int *)((long)arg2 + 0x84);
    }
    *(undefined8 *)((long)arg2 + 0x98) = 0;
    if ((*(long *)((long)arg1 + 0xb98) != 0) && (iVar16 - iVar26 != 0 && iVar26 <= iVar16)) {
      puVar27 = VP8DecompressAlphaRows((VP8Decoder *)arg1,(VP8Io *)arg2,iVar26,iVar16 - iVar26);
      *(uint8_t **)((long)arg2 + 0x98) = puVar27;
      if (puVar27 == (uint8_t *)0x0) {
        iVar8 = VP8SetError((VP8Decoder *)arg1,VP8_STATUS_BITSTREAM_ERROR,
                            "Could not decode alpha data.");
        return iVar8;
      }
    }
    iVar9 = 1;
    iVar5 = *(int *)((long)arg2 + 0x80);
    iVar14 = iVar5 - iVar26;
    if (iVar14 != 0 && iVar26 <= iVar5) {
      *(long *)((long)arg2 + 0x18) =
           *(long *)((long)arg2 + 0x18) + (long)*(int *)((long)arg1 + 0xb40) * (long)iVar14;
      lVar22 = (long)(iVar14 >> 1) * (long)*(int *)((long)arg1 + 0xb44);
      *(long *)((long)arg2 + 0x20) = *(long *)((long)arg2 + 0x20) + lVar22;
      *(long *)((long)arg2 + 0x28) = *(long *)((long)arg2 + 0x28) + lVar22;
      iVar26 = iVar5;
      if (puVar27 == (uint8_t *)0x0) {
        puVar27 = (uint8_t *)0x0;
      }
      else {
        puVar27 = puVar27 + (long)*arg2 * (long)iVar14;
        *(uint8_t **)((long)arg2 + 0x98) = puVar27;
      }
    }
    if (iVar16 - iVar26 != 0 && iVar26 <= iVar16) {
      iVar9 = *(int *)((long)arg2 + 0x78);
      *(long *)((long)arg2 + 0x18) = *(long *)((long)arg2 + 0x18) + (long)iVar9;
      *(long *)((long)arg2 + 0x20) = *(long *)((long)arg2 + 0x20) + (long)(iVar9 >> 1);
      *(long *)((long)arg2 + 0x28) = *(long *)((long)arg2 + 0x28) + (long)(iVar9 >> 1);
      if (puVar27 != (uint8_t *)0x0) {
        *(uint8_t **)((long)arg2 + 0x98) = puVar27 + iVar9;
      }
      *(int *)((long)arg2 + 8) = iVar26 - iVar5;
      *(int *)((long)arg2 + 0xc) = *(int *)((long)arg2 + 0x7c) - iVar9;
      *(int *)((long)arg2 + 0x10) = iVar16 - iVar26;
      iVar9 = (**(code **)((long)arg2 + 0x40))(arg2);
    }
  }
  if (iVar8 + 1 == *(int *)((long)arg1 + 0xd0) && iVar4 < iVar20) {
    memcpy((void *)(*(long *)((long)arg1 + 0xb28) - __n_00),
           (void *)(lVar10 + (long)*(int *)((long)arg1 + 0xb40) * 0x10),__n_00);
    memcpy((void *)(*(long *)((long)arg1 + 0xb30) + -__n),
           (void *)(lVar13 + (long)*(int *)((long)arg1 + 0xb44) * 8),__n);
    memcpy((void *)(-__n + *(long *)((long)arg1 + 0xb38)),
           (void *)(lVar29 + (long)*(int *)((long)arg1 + 0xb44) * 8),__n);
  }
  return iVar9;
}

Assistant:

static int FinishRow(void* arg1, void* arg2) {
  VP8Decoder* const dec = (VP8Decoder*)arg1;
  VP8Io* const io = (VP8Io*)arg2;
  int ok = 1;
  const VP8ThreadContext* const ctx = &dec->thread_ctx;
  const int cache_id = ctx->id;
  const int extra_y_rows = kFilterExtraRows[dec->filter_type];
  const int ysize = extra_y_rows * dec->cache_y_stride;
  const int uvsize = (extra_y_rows / 2) * dec->cache_uv_stride;
  const int y_offset = cache_id * 16 * dec->cache_y_stride;
  const int uv_offset = cache_id * 8 * dec->cache_uv_stride;
  uint8_t* const ydst = dec->cache_y - ysize + y_offset;
  uint8_t* const udst = dec->cache_u - uvsize + uv_offset;
  uint8_t* const vdst = dec->cache_v - uvsize + uv_offset;
  const int mb_y = ctx->mb_y;
  const int is_first_row = (mb_y == 0);
  const int is_last_row = (mb_y >= dec->br_mb_y - 1);

  if (dec->mt_method == 2) {
    ReconstructRow(dec, ctx);
  }

  if (ctx->filter_row) {
    FilterRow(dec);
  }

  if (dec->dither) {
    DitherRow(dec);
  }

  if (io->put != NULL) {
    int y_start = MACROBLOCK_VPOS(mb_y);
    int y_end = MACROBLOCK_VPOS(mb_y + 1);
    if (!is_first_row) {
      y_start -= extra_y_rows;
      io->y = ydst;
      io->u = udst;
      io->v = vdst;
    } else {
      io->y = dec->cache_y + y_offset;
      io->u = dec->cache_u + uv_offset;
      io->v = dec->cache_v + uv_offset;
    }

    if (!is_last_row) {
      y_end -= extra_y_rows;
    }
    if (y_end > io->crop_bottom) {
      y_end = io->crop_bottom;    // make sure we don't overflow on last row.
    }
    // If dec->alpha_data is not NULL, we have some alpha plane present.
    io->a = NULL;
    if (dec->alpha_data != NULL && y_start < y_end) {
      io->a = VP8DecompressAlphaRows(dec, io, y_start, y_end - y_start);
      if (io->a == NULL) {
        return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                           "Could not decode alpha data.");
      }
    }
    if (y_start < io->crop_top) {
      const int delta_y = io->crop_top - y_start;
      y_start = io->crop_top;
      assert(!(delta_y & 1));
      io->y += dec->cache_y_stride * delta_y;
      io->u += dec->cache_uv_stride * (delta_y >> 1);
      io->v += dec->cache_uv_stride * (delta_y >> 1);
      if (io->a != NULL) {
        io->a += io->width * delta_y;
      }
    }
    if (y_start < y_end) {
      io->y += io->crop_left;
      io->u += io->crop_left >> 1;
      io->v += io->crop_left >> 1;
      if (io->a != NULL) {
        io->a += io->crop_left;
      }
      io->mb_y = y_start - io->crop_top;
      io->mb_w = io->crop_right - io->crop_left;
      io->mb_h = y_end - y_start;
      ok = io->put(io);
    }
  }
  // rotate top samples if needed
  if (cache_id + 1 == dec->num_caches) {
    if (!is_last_row) {
      memcpy(dec->cache_y - ysize, ydst + 16 * dec->cache_y_stride, ysize);
      memcpy(dec->cache_u - uvsize, udst + 8 * dec->cache_uv_stride, uvsize);
      memcpy(dec->cache_v - uvsize, vdst + 8 * dec->cache_uv_stride, uvsize);
    }
  }

  return ok;
}